

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SeekHead::AddSeekEntry(SeekHead *this,uint32_t id,uint64_t pos)

{
  int32_t i;
  uint64_t pos_local;
  uint32_t id_local;
  SeekHead *this_local;
  
  i = 0;
  while( true ) {
    if (4 < i) {
      return false;
    }
    if (this->seek_entry_id_[i] == 0) break;
    i = i + 1;
  }
  this->seek_entry_id_[i] = id;
  this->seek_entry_pos_[i] = pos;
  return true;
}

Assistant:

bool SeekHead::AddSeekEntry(uint32_t id, uint64_t pos) {
  for (int32_t i = 0; i < kSeekEntryCount; ++i) {
    if (seek_entry_id_[i] == 0) {
      seek_entry_id_[i] = id;
      seek_entry_pos_[i] = pos;
      return true;
    }
  }
  return false;
}